

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

UniquePtr<SSL_CTX> __thiscall
bssl::anon_unknown_0::CreateContextWithTestCertificate(anon_unknown_0 *this,SSL_METHOD *method)

{
  int iVar1;
  UniquePtr<SSL_CTX> ctx;
  UniquePtr<EVP_PKEY> key;
  UniquePtr<X509> cert;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_20;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_18;
  _Head_base<0UL,_x509_st_*,_false> local_10;
  
  local_20._M_head_impl = (ssl_ctx_st *)SSL_CTX_new((SSL_METHOD *)method);
  GetTestCertificate();
  GetTestKey();
  if (((local_20._M_head_impl != (ssl_ctx_st *)0x0) &&
      ((X509 *)local_10._M_head_impl != (X509 *)0x0)) &&
     ((EVP_PKEY *)local_18._M_head_impl != (EVP_PKEY *)0x0)) {
    iVar1 = SSL_CTX_use_certificate((SSL_CTX *)local_20._M_head_impl,(X509 *)local_10._M_head_impl);
    if (iVar1 != 0) {
      iVar1 = SSL_CTX_use_PrivateKey
                        ((SSL_CTX *)local_20._M_head_impl,(EVP_PKEY *)local_18._M_head_impl);
      if (iVar1 != 0) {
        *(ssl_ctx_st **)this = local_20._M_head_impl;
        local_20._M_head_impl = (ssl_ctx_st *)0x0;
        goto LAB_0015da46;
      }
    }
  }
  *(undefined8 *)this = 0;
LAB_0015da46:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_18);
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_10);
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_20);
  return (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<SSL_CTX> CreateContextWithTestCertificate(
    const SSL_METHOD *method) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(method));
  bssl::UniquePtr<X509> cert = GetTestCertificate();
  bssl::UniquePtr<EVP_PKEY> key = GetTestKey();
  if (!ctx || !cert || !key ||
      !SSL_CTX_use_certificate(ctx.get(), cert.get()) ||
      !SSL_CTX_use_PrivateKey(ctx.get(), key.get())) {
    return nullptr;
  }
  return ctx;
}